

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseClicked(ImGuiMouseButton button,ImGuiID owner_id,ImGuiInputFlags flags)

{
  float t1;
  float repeat_delay;
  bool bVar1;
  int iVar2;
  
  if ((((GImGui->IO).MouseDown[button] == true) &&
      (t1 = (GImGui->IO).MouseDownDuration[button], 0.0 <= t1)) &&
     (((t1 == 0.0 && (!NAN(t1))) ||
      ((((flags & 1U) != 0 && (repeat_delay = (GImGui->IO).KeyRepeatDelay, repeat_delay < t1)) &&
       (iVar2 = CalcTypematicRepeatAmount
                          (t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,(GImGui->IO).KeyRepeatRate),
       0 < iVar2)))))) {
    bVar1 = TestKeyOwner(button + ImGuiKey_MouseLeft,owner_id);
    return bVar1;
  }
  return false;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button]) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = g.IO.MouseDownDuration[button];
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!

    const bool repeat = (flags & ImGuiInputFlags_Repeat) != 0;
    const bool pressed = (t == 0.0f) || (repeat && t > g.IO.KeyRepeatDelay && CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0);
    if (!pressed)
        return false;

    if (!TestKeyOwner(MouseButtonToKey(button), owner_id))
        return false;

    return true;
}